

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.h
# Opt level: O3

bool __thiscall Assimp::MD5::MD5Parser::SkipLine(MD5Parser *this)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  
  pbVar3 = (byte *)this->buffer;
  this->lineNumber = this->lineNumber + 1;
  while( true ) {
    bVar2 = *pbVar3;
    if ((bVar2 < 0xe) && ((0x2401U >> (bVar2 & 0x1f) & 1) != 0)) break;
    pbVar3 = pbVar3 + 1;
  }
  while ((bVar2 == 0xd || (bVar2 == 10))) {
    pbVar1 = pbVar3 + 1;
    pbVar3 = pbVar3 + 1;
    bVar2 = *pbVar1;
  }
  this->buffer = (char *)pbVar3;
  return *pbVar3 != 0;
}

Assistant:

bool SkipLine( )
    {
        return SkipLine(buffer,(const char**)&buffer);
    }